

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseBlockDeclaration(WastParser *this,BlockDeclaration *decl)

{
  Var *this_00;
  Result RVar1;
  Enum EVar2;
  FuncDeclaration func_decl;
  FuncDeclaration local_c8;
  Location local_48;
  
  this_00 = &local_c8.type_var;
  local_c8.has_func_type = false;
  local_48.field_1.field_0.line = 0;
  local_48.field_1._4_8_ = 0;
  local_48.filename.data_ = (char *)0x0;
  local_48.filename.size_._0_4_ = 0;
  local_48.filename.size_._4_4_ = 0;
  Var::Var(this_00,0xffffffff,&local_48);
  local_c8.sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RVar1 = ParseTypeUseOpt(this,&local_c8);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = ParseUnboundFuncSignature(this,&local_c8.sig);
    if (RVar1.enum_ != Error) {
      decl->has_func_type = local_c8.has_func_type;
      Var::operator=(&decl->type_var,this_00);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&(decl->sig).param_types,&local_c8.sig.param_types);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&(decl->sig).result_types,&local_c8.sig.result_types);
      EVar2 = Ok;
    }
  }
  if (local_c8.sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.sig.result_types.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.sig.param_types.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Var::~Var(this_00);
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseBlockDeclaration(BlockDeclaration* decl) {
  WABT_TRACE(ParseBlockDeclaration);
  FuncDeclaration func_decl;
  CHECK_RESULT(ParseTypeUseOpt(&func_decl));
  CHECK_RESULT(ParseUnboundFuncSignature(&func_decl.sig));
  decl->has_func_type = func_decl.has_func_type;
  decl->type_var = func_decl.type_var;
  decl->sig = func_decl.sig;
  return Result::Ok;
}